

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O3

parameters * parameters_get(int K)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  parameters *in_RDI;
  int iVar8;
  int iVar9;
  
  if (0 < K) {
    lVar6 = 0x10;
    do {
      iVar1 = *(int *)((long)&base_param_sets_sz + lVar6);
      if (K <= iVar1) {
        iVar2 = *(int *)(&UNK_001030e4 + lVar6);
        iVar3 = *(int *)(&UNK_001030e8 + lVar6);
        iVar4 = *(int *)(&UNK_001030ec + lVar6);
        iVar5 = *(int *)((long)&base_param_sets[0].Kprime + lVar6);
        iVar9 = iVar3 + iVar4 + iVar1;
        iVar8 = iVar9 - iVar5;
        lVar6 = 0;
        goto LAB_001016d3;
      }
      lVar6 = lVar6 + 0x14;
    } while (lVar6 != 0x2554);
  }
  in_RDI->H = 0;
  in_RDI->B = 0;
  in_RDI->W = 0;
  in_RDI->P = 0;
  in_RDI->Kprime = 0;
  in_RDI->J = 0;
  in_RDI->L = 0;
  in_RDI->S = 0;
  in_RDI->P1 = 0;
  in_RDI->U = 0;
  in_RDI->K = -1;
  return in_RDI;
  while (lVar6 = lVar6 + 4, lVar6 != 0x4bc) {
LAB_001016d3:
    iVar7 = *(int *)((long)&nextprime_small_primes + lVar6);
    if (iVar8 <= iVar7) goto LAB_001016ee;
  }
  iVar7 = -1;
LAB_001016ee:
  in_RDI->K = K;
  in_RDI->Kprime = iVar1;
  in_RDI->J = iVar2;
  in_RDI->L = iVar9;
  in_RDI->S = iVar3;
  in_RDI->H = iVar4;
  in_RDI->B = iVar5 - iVar3;
  in_RDI->W = iVar5;
  in_RDI->P = iVar8;
  in_RDI->P1 = iVar7;
  in_RDI->U = iVar8 - iVar4;
  return in_RDI;
}

Assistant:

parameters parameters_get(int K)
{
	/* Input validation */
	if (K <= 0) {
		return (parameters){ -1 };
	}

	/* Determine Kprime, J, S, H and W from param_sets */
	parameters R = { .K = K };
	int i;
	for (i = 0; i < base_param_sets_sz; ++i) {
		if (K <= base_param_sets[i].Kprime) {
			const base_param_set* P = &base_param_sets[i];
			R.Kprime = P->Kprime;
			R.J = P->J;
			R.S = P->S;
			R.H = P->H;
			R.W = P->W;
			break;
		}
	}
	if (i == base_param_sets_sz) {
		return (parameters){ -1 };
	}

	/* Assign the remaining variables */
	R.L = R.Kprime + R.S + R.H;
	R.P = R.L - R.W;
	R.P1 = nextprime(R.P);
	R.U = R.P - R.H;
	R.B = R.W - R.S;

	return R;
}